

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxNodeHeap.h
# Opt level: O2

void __thiscall maxNodeHeap::siftDown(maxNodeHeap *this,int pos)

{
  int iVar1;
  pointer pQVar2;
  pointer ppVar3;
  pointer ppVar4;
  int iVar5;
  int iVar6;
  int __tmp;
  int iVar7;
  pointer ppVar8;
  
  pQVar2 = (this->m_elements).
           super__Vector_base<QElement<maxNodeHeap::Data>,_std::allocator<QElement<maxNodeHeap::Data>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar3 = (this->m_heap).
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  ppVar4 = (this->m_heap).
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
  do {
    iVar1 = ppVar3[pos].first;
    iVar6 = pos * 2 + 1;
    iVar7 = pos * 2 + 2;
    iVar5 = (int)((ulong)((long)ppVar4 - (long)ppVar3) >> 3);
    if (iVar7 < iVar5) {
      if ((ppVar3[iVar6].first < iVar1) && (ppVar3[iVar7].first < iVar1)) {
        return;
      }
      if (ppVar3[iVar6].first <= ppVar3[iVar7].first) {
        iVar6 = iVar7;
      }
      ppVar8 = ppVar3 + iVar6;
      iVar5 = ppVar8->first;
    }
    else {
      if (iVar5 <= iVar6) {
        return;
      }
      iVar5 = ppVar3[iVar6].first;
      if (iVar5 <= iVar1) {
        return;
      }
      ppVar8 = ppVar3 + iVar6;
    }
    ppVar3[pos].first = iVar5;
    ppVar8->first = iVar1;
    iVar1 = ppVar3[pos].second;
    ppVar3[pos].second = ppVar8->second;
    ppVar8->second = iVar1;
    pQVar2[ppVar3[pos].second].m_index = pos;
    pQVar2[iVar1].m_index = iVar6;
    pos = iVar6;
  } while( true );
}

Assistant:

inline void maxNodeHeap::siftDown( int pos ) {

        int curKey   = m_heap[pos].first;
        int lhsChild = 2*pos+1;
        int rhsChild = 2*pos+2;
        if( rhsChild < (int) m_heap.size() ) {

                int lhsKey = m_heap[lhsChild].first;
                int rhsKey = m_heap[rhsChild].first;

                if( lhsKey < curKey && rhsKey < curKey) {
                        return; // we are done
                } else {
                        //exchange with the larger one (maxHeap)
                        int swap_pos = lhsKey > rhsKey ? lhsChild : rhsChild;
                        std::swap( m_heap[pos], m_heap[swap_pos]);

                        int element_pos = m_heap[pos].second;
                        m_elements[element_pos].set_index(pos);

                        element_pos = m_heap[swap_pos].second;
                        m_elements[element_pos].set_index(swap_pos);

                        siftDown(swap_pos);
                        return;
                }

        } else if ( lhsChild < (int)m_heap.size()) {
                if( m_heap[pos].first < m_heap[lhsChild].first) {
                        std::swap( m_heap[pos], m_heap[lhsChild]);

                        int element_pos = m_heap[pos].second;
                        m_elements[element_pos].set_index(pos);

                        element_pos = m_heap[lhsChild].second;
                        m_elements[element_pos].set_index(lhsChild);

                        siftDown(lhsChild);
                        return;
                } else {
                        return; // we are done
                }
        }
}